

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenFsm(char *pFileName,int nPis,int nPos,int nStates,int nLines,int ProbI,int ProbO)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Wrd_t *p;
  Vec_Str_t *p_00;
  FILE *__stream;
  char *pcVar4;
  word wVar5;
  int nDigits;
  int iState2;
  int iState;
  int i;
  Vec_Str_t *vCond;
  Vec_Wrd_t *vStates;
  FILE *pFile;
  int ProbI_local;
  int nLines_local;
  int nStates_local;
  int nPos_local;
  int nPis_local;
  char *pFileName_local;
  
  uVar1 = Abc_Base10Log(nStates);
  Aig_ManRandom(1);
  p = Vec_WrdAlloc(nLines);
  p_00 = Vec_StrAlloc(1000);
  iState2 = 0;
  while (iState2 < nStates) {
    uVar2 = Aig_ManRandom(0);
    if (uVar2 % (uint)nStates != iState2) {
      Vec_WrdPush(p,(long)iState2 << 0x20 | (long)(int)(uVar2 % (uint)nStates));
      iState2 = iState2 + 1;
    }
  }
  while (iState2 < nLines) {
    uVar2 = Aig_ManRandom(0);
    uVar3 = Aig_ManRandom(0);
    if (uVar3 % (uint)nStates != uVar2 % (uint)nStates) {
      Vec_WrdPush(p,(long)(int)(uVar2 % (uint)nStates) << 0x20 | (long)(int)(uVar3 % (uint)nStates))
      ;
      iState2 = iState2 + 1;
    }
  }
  Vec_WrdSort(p,0);
  __stream = fopen(pFileName,"w");
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# This random FSM was generated by ABC on %s\n",pcVar4);
  fprintf(__stream,"# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n",
          (ulong)(uint)nPis,(ulong)(uint)nPos,(ulong)(uint)nStates,(ulong)(uint)nLines,ProbI,ProbO,
          pFileName);
  fprintf(__stream,"# FSM has %d inputs, %d outputs, %d states, and %d products\n",(ulong)(uint)nPis
          ,(ulong)(uint)nPos,(ulong)(uint)nStates,(ulong)(uint)nLines);
  fprintf(__stream,".i %d\n",(ulong)(uint)nPis);
  fprintf(__stream,".o %d\n",(ulong)(uint)nPos);
  fprintf(__stream,".p %d\n",(ulong)(uint)nLines);
  fprintf(__stream,".s %d\n",(ulong)(uint)nStates);
  for (iState2 = 0; iState2 < nLines; iState2 = iState2 + 1) {
    Abc_GenFsmCond(p_00,nPis,ProbI);
    pcVar4 = Vec_StrArray(p_00);
    fprintf(__stream,"%s ",pcVar4);
    wVar5 = Vec_WrdEntry(p,iState2);
    fprintf(__stream,"%0*d ",(ulong)uVar1,wVar5 >> 0x20);
    wVar5 = Vec_WrdEntry(p,iState2);
    fprintf(__stream,"%0*d ",(ulong)uVar1,wVar5 & 0xffffffff);
    if (0 < nPos) {
      Abc_GenFsmCond(p_00,nPos,ProbO);
      pcVar4 = Vec_StrArray(p_00);
      fprintf(__stream,"%s",pcVar4);
    }
    fprintf(__stream,"\n");
  }
  fprintf(__stream,".e");
  fprintf(__stream,"\n");
  fclose(__stream);
  Vec_WrdFree(p);
  Vec_StrFree(p_00);
  return;
}

Assistant:

void Abc_GenFsm( char * pFileName, int nPis, int nPos, int nStates, int nLines, int ProbI, int ProbO )
{
    FILE * pFile;
    Vec_Wrd_t * vStates;
    Vec_Str_t * vCond;
    int i, iState, iState2;
    int nDigits = Abc_Base10Log( nStates );
    Aig_ManRandom( 1 );
    vStates = Vec_WrdAlloc( nLines );
    vCond = Vec_StrAlloc( 1000 );
    for ( i = 0; i < nStates; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        if ( iState == i )
            continue;
        Vec_WrdPush( vStates, ((word)i << 32) | iState );
        i++;
    }
    for (      ; i < nLines; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        iState2 = Aig_ManRandom( 0 ) % nStates;
        if ( iState2 == iState )
            continue;
        Vec_WrdPush( vStates, ((word)iState << 32) | iState2 );
        i++;
    }
    Vec_WrdSort( vStates, 0 );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# This random FSM was generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n", nPis, nPos, nStates, nLines, ProbI, ProbO, pFileName );
    fprintf( pFile, "# FSM has %d inputs, %d outputs, %d states, and %d products\n", nPis, nPos, nStates, nLines );
    fprintf( pFile, ".i %d\n", nPis );
    fprintf( pFile, ".o %d\n", nPos );
    fprintf( pFile, ".p %d\n", nLines );
    fprintf( pFile, ".s %d\n", nStates );
    for ( i = 0; i < nLines; i++ )
    {
        Abc_GenFsmCond( vCond, nPis, ProbI );
        fprintf( pFile, "%s ", Vec_StrArray(vCond) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i) >> 32) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i)) );
        if ( nPos > 0 )
        {
            Abc_GenFsmCond( vCond, nPos, ProbO );
            fprintf( pFile, "%s", Vec_StrArray(vCond) );
        }
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e" );
    fprintf( pFile, "\n" );
    fclose( pFile );
    Vec_WrdFree( vStates );
    Vec_StrFree( vCond );
}